

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testClassification.cpp
# Opt level: O2

void anon_unknown.dwarf_fad0e::testClass
               (half h,bool finite,bool normalized,bool denormalized,bool zero,bool nan,
               bool infinity,bool negative)

{
  uint __line;
  long lVar1;
  ushort uVar2;
  ostream *poVar3;
  ushort uVar4;
  char *__assertion;
  ushort uVar5;
  bool bVar6;
  bool bVar7;
  
  lVar1 = std::cout;
  *(undefined8 *)(Imath_3_2::hsv2rgb_d + *(long *)(std::cout + -0x18)) = 0xf;
  *(undefined8 *)(operator_delete__ + *(long *)(lVar1 + -0x18)) = 8;
  poVar3 = (ostream *)operator<<((ostream *)&std::cout,(half)h._h);
  std::operator<<(poVar3,"    ");
  printBits((ostream *)&std::cout,(half)h._h);
  std::operator<<((ostream *)&std::cout,"    ");
  uVar4 = h._h & 0x7c00;
  if (uVar4 != 0x7c00) {
    std::operator<<((ostream *)&std::cout,"finite ");
  }
  uVar2 = h._h >> 10 & 0x1f;
  if (((h._h & 0x7c00) != 0) && (uVar2 != 0x1f)) {
    std::operator<<((ostream *)&std::cout,"normalized ");
  }
  bVar6 = (h._h & 0x3ff) != 0;
  if (bVar6 && uVar4 == 0) {
    std::operator<<((ostream *)&std::cout,"denormalized ");
  }
  uVar5 = h._h & 0x7fff;
  if (uVar5 == 0) {
    std::operator<<((ostream *)&std::cout,"zero ");
  }
  bVar7 = (h._h & 0x3ff) != 0;
  if (uVar4 == 0x7c00 && bVar7) {
    std::operator<<((ostream *)&std::cout,"nan ");
  }
  if (uVar5 == 0x7c00) {
    std::operator<<((ostream *)&std::cout,"infinity ");
  }
  if ((short)h._h < 0) {
    std::operator<<((ostream *)&std::cout,"negative ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  if ((uVar4 != 0x7c00) == finite) {
    if (((h._h & 0x7c00) != 0 && uVar2 != 0x1f) == normalized) {
      if ((bVar6 && uVar4 == 0) == denormalized) {
        if ((uVar5 == 0) == zero) {
          if ((uVar4 == 0x7c00 && bVar7) == nan) {
            if ((uVar5 == 0x7c00) == infinity) {
              if ((short)h._h < 0 == negative) {
                return;
              }
              __assertion = "h.isNegative () == negative";
              __line = 0x43;
            }
            else {
              __assertion = "h.isInfinity () == infinity";
              __line = 0x42;
            }
          }
          else {
            __assertion = "h.isNan () == nan";
            __line = 0x41;
          }
        }
        else {
          __assertion = "h.isZero () == zero";
          __line = 0x40;
        }
      }
      else {
        __assertion = "h.isDenormalized () == denormalized";
        __line = 0x3f;
      }
    }
    else {
      __assertion = "h.isNormalized () == normalized";
      __line = 0x3e;
    }
  }
  else {
    __assertion = "h.isFinite () == finite";
    __line = 0x3d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testClassification.cpp"
                ,__line,
                "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
               );
}

Assistant:

void
testClass (
    half h,
    bool finite,
    bool normalized,
    bool denormalized,
    bool zero,
    bool nan,
    bool infinity,
    bool negative)
{
    cout.width (15);
    cout.precision (8);

    cout << h << "    ";
    printBits (cout, h);
    cout << "    ";

    if (h.isFinite ()) cout << "finite ";

    if (h.isNormalized ()) cout << "normalized ";

    if (h.isDenormalized ()) cout << "denormalized ";

    if (h.isZero ()) cout << "zero ";

    if (h.isNan ()) cout << "nan ";

    if (h.isInfinity ()) cout << "infinity ";

    if (h.isNegative ()) cout << "negative ";

    cout << endl;

    assert (h.isFinite () == finite);
    assert (h.isNormalized () == normalized);
    assert (h.isDenormalized () == denormalized);
    assert (h.isZero () == zero);
    assert (h.isNan () == nan);
    assert (h.isInfinity () == infinity);
    assert (h.isNegative () == negative);
}